

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::cdUp(QDir *this)

{
  long lVar1;
  byte bVar2;
  long in_FS_OFFSET;
  QString *in_stack_00000010;
  QDir *in_stack_00000018;
  undefined1 in_stack_00000030 [16];
  char (*in_stack_ffffffffffffffb8) [3];
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<3ul>
            ((QByteArrayView *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  QString::fromLatin1((QByteArrayView)in_stack_00000030);
  bVar2 = cd(in_stack_00000018,in_stack_00000010);
  QString::~QString((QString *)0x19108c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::cdUp()
{
    return cd(QString::fromLatin1(".."));
}